

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O0

void __thiscall absl::strings_internal::BigUnsigned<4>::BigUnsigned(BigUnsigned<4> *this,uint64_t v)

{
  uint32_t *local_30;
  uint local_24;
  uint64_t v_local;
  BigUnsigned<4> *this_local;
  
  if (v >> 0x20 == 0) {
    local_24 = (uint)(v != 0);
  }
  else {
    local_24 = 2;
  }
  this->size_ = local_24;
  *(uint64_t *)this->words_ = v;
  local_30 = this->words_ + 2;
  do {
    *local_30 = 0;
    local_30 = local_30 + 1;
  } while ((BigUnsigned<4> *)local_30 != this + 1);
  return;
}

Assistant:

explicit constexpr BigUnsigned(uint64_t v)
      : size_((v >> 32) ? 2 : v ? 1 : 0),
        words_{static_cast<uint32_t>(v & 0xffffffffu),
               static_cast<uint32_t>(v >> 32)} {}